

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expanddims.cpp
# Opt level: O0

int __thiscall
ncnn::ExpandDims::forward(ExpandDims *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  long in_RSI;
  long in_RDI;
  int dims;
  int h;
  int w;
  Mat *in_stack_fffffffffffffdb0;
  Mat *in_stack_fffffffffffffdb8;
  Mat *this_00;
  Allocator *in_stack_fffffffffffffde8;
  int iVar2;
  Mat *in_stack_fffffffffffffdf8;
  Allocator *in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe3c;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  Mat *in_stack_fffffffffffffe48;
  int local_4;
  
  iVar2 = *(int *)(in_RSI + 0x20);
  Mat::operator=(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  if (iVar2 == 1) {
    iVar2 = (int)((ulong)in_RDI >> 0x20);
    if (*(int *)(in_RDI + 0x80) == 0) {
      if (*(int *)(in_RDI + 0x84) != 0) {
        if (*(int *)(in_RDI + 0x88) == 0) {
          Mat::reshape(in_stack_fffffffffffffdf8,iVar2,(int)in_RDI,in_stack_fffffffffffffde8);
          Mat::operator=(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
          Mat::~Mat((Mat *)0x149711);
        }
        else {
          Mat::reshape(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,in_stack_fffffffffffffe40
                       ,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe30);
          Mat::operator=(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
          Mat::~Mat((Mat *)0x149693);
        }
      }
    }
    else if (*(int *)(in_RDI + 0x84) == 0) {
      if (*(int *)(in_RDI + 0x88) == 0) {
        Mat::reshape(in_stack_fffffffffffffdf8,iVar2,(int)in_RDI,in_stack_fffffffffffffde8);
        Mat::operator=(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
        Mat::~Mat((Mat *)0x1495e9);
      }
      else {
        Mat::reshape(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,in_stack_fffffffffffffe40,
                     in_stack_fffffffffffffe3c,in_stack_fffffffffffffe30);
        Mat::operator=(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
        Mat::~Mat((Mat *)0x14956b);
      }
    }
    else {
      Mat::reshape(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,in_stack_fffffffffffffe40,
                   in_stack_fffffffffffffe3c,in_stack_fffffffffffffe30);
      Mat::operator=(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      Mat::~Mat((Mat *)0x1494d7);
    }
  }
  else if (iVar2 == 2) {
    if (*(int *)(in_RDI + 0x80) == 0) {
      if (*(int *)(in_RDI + 0x84) == 0) {
        if (*(int *)(in_RDI + 0x88) != 0) {
          in_stack_fffffffffffffdb0 = (Mat *)&stack0xfffffffffffffdf8;
          Mat::reshape(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,in_stack_fffffffffffffe40
                       ,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe30);
          Mat::operator=(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
          Mat::~Mat((Mat *)0x1498e3);
        }
      }
      else {
        this_00 = (Mat *)&stack0xfffffffffffffe30;
        Mat::reshape(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,in_stack_fffffffffffffe40,
                     in_stack_fffffffffffffe3c,in_stack_fffffffffffffe30);
        Mat::operator=(this_00,in_stack_fffffffffffffdb0);
        Mat::~Mat((Mat *)0x149855);
      }
    }
    else {
      Mat::reshape(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,in_stack_fffffffffffffe40,
                   in_stack_fffffffffffffe3c,in_stack_fffffffffffffe30);
      Mat::operator=(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      Mat::~Mat((Mat *)0x1497bd);
    }
  }
  bVar1 = Mat::empty(in_stack_fffffffffffffdb0);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ExpandDims::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int dims = bottom_blob.dims;

    top_blob = bottom_blob;

    if (dims == 1)
    {
        if (expand_w)
        {
            if (expand_h)
                top_blob = bottom_blob.reshape(1, 1, w, opt.blob_allocator);
            else if (expand_c)
                top_blob = bottom_blob.reshape(1, w, 1, opt.blob_allocator);
            else
                top_blob = bottom_blob.reshape(1, w, opt.blob_allocator);
        }
        else if (expand_h)
        {
            if (expand_c)
                top_blob = bottom_blob.reshape(w, 1, 1, opt.blob_allocator);
            else
                top_blob = bottom_blob.reshape(w, 1, opt.blob_allocator);
        }
    }
    else if (dims == 2)
    {
        if (expand_w)
            top_blob = bottom_blob.reshape(1, w, h, opt.blob_allocator);
        else if (expand_h)
            top_blob = bottom_blob.reshape(w, 1, h, opt.blob_allocator);
        else if (expand_c)
            top_blob = bottom_blob.reshape(w, h, 1, opt.blob_allocator);
    }

    if (top_blob.empty())
        return -100;

    return 0;
}